

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_loadfile(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  GCstr *pGVar3;
  int status;
  GCstr *mode;
  GCstr *fname;
  char *in_stack_00001ff0;
  char *in_stack_00001ff8;
  lua_State *in_stack_00002000;
  int in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  lua_State *in_stack_ffffffffffffffd0;
  lua_State *L_00;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pGVar2 = lj_lib_optstr(in_stack_ffffffffffffffd0,iVar1);
  pGVar3 = lj_lib_optstr(in_stack_ffffffffffffffd0,iVar1);
  lua_settop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (pGVar2 == (GCstr *)0x0) {
    L_00 = (lua_State *)0x0;
  }
  else {
    L_00 = (lua_State *)(pGVar2 + 1);
  }
  if (pGVar3 == (GCstr *)0x0) {
    pGVar3 = (GCstr *)0x0;
  }
  else {
    pGVar3 = pGVar3 + 1;
  }
  luaL_loadfilex(in_stack_00002000,in_stack_00001ff8,in_stack_00001ff0);
  iVar1 = load_aux(L_00,(int)((ulong)pGVar3 >> 0x20),(int)pGVar3);
  return iVar1;
}

Assistant:

LJLIB_CF(loadfile)
{
  GCstr *fname = lj_lib_optstr(L, 1);
  GCstr *mode = lj_lib_optstr(L, 2);
  int status;
  lua_settop(L, 3);  /* Ensure env arg exists. */
  status = luaL_loadfilex(L, fname ? strdata(fname) : NULL,
			  mode ? strdata(mode) : NULL);
  return load_aux(L, status, 3);
}